

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int is_mixedcase(char *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  size_t sVar7;
  
  if (((str != (char *)0x0) && (*str != '\0')) && (sVar1 = strlen(str), sVar1 != 0)) {
    sVar7 = 0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar5 = 1;
      uVar6 = 1;
      if (uVar4 == 0) {
        ppuVar2 = __ctype_b_loc();
        uVar6 = (*ppuVar2)[str[sVar7]] >> 9 & 1;
      }
      if (uVar3 == 0) {
        ppuVar2 = __ctype_b_loc();
        uVar5 = (*ppuVar2)[str[sVar7]] >> 8 & 1;
      }
      if ((byte)((byte)uVar6 & (byte)uVar5) == 1) {
        return 1;
      }
      sVar7 = sVar7 + 1;
      uVar4 = uVar6;
      uVar3 = uVar5;
    } while (sVar1 != sVar7);
  }
  return 0;
}

Assistant:

static int is_mixedcase(const char * str)
{
   size_t c;
   int hasupper = 0, haslower = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( !haslower && islower((int) str[c]) ) haslower = 1;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;

      if( haslower && hasupper ) return 1;
   }

   return 0;
}